

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall
WavingSketch<8U,_1U,_4U>::mergebuck
          (WavingSketch<8U,_1U,_4U> *this,Bucket *src1,Bucket *src2,Bucket *dest)

{
  int iVar1;
  uint uVar2;
  undefined1 (*pauVar3) [32];
  long lVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  
  dest->incast[0] = src2->incast[0] + src1->incast[0];
  pauVar3 = (undefined1 (*) [32])operator_new__(0x80);
  auVar9 = ZEXT816(0) << 0x40;
  *pauVar3 = ZEXT1632(auVar9);
  pauVar3[1] = ZEXT1632(auVar9);
  pauVar3[2] = ZEXT1632(auVar9);
  pauVar3[3] = ZEXT1632(auVar9);
  piVar8 = src1->counters;
  iVar5 = this->cnt;
  lVar4 = 0;
  do {
    *(int *)((long)*pauVar3 + lVar4 + 4) = *(int *)((Bucket *)(piVar8 + -8))->items[0].str;
    iVar1 = *piVar8;
    *(int *)((long)*pauVar3 + lVar4) = iVar1;
    iVar5 = iVar5 + -1 + (uint)(iVar1 == 0);
    this->cnt = iVar5;
    lVar4 = lVar4 + 8;
    piVar8 = piVar8 + 1;
  } while (lVar4 != 0x40);
  lVar6 = -8;
  lVar4 = 0x40;
  do {
    *(int *)((long)*pauVar3 + lVar4 + 4) = src2->counters[lVar6];
    iVar5 = *(int *)(src2->incast + lVar6 * 2);
    *(int *)((long)*pauVar3 + lVar4) = iVar5;
    this->cnt = this->cnt + -1 + (uint)(iVar5 == 0);
    lVar4 = lVar4 + 8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  if (lVar4 != 0) {
    lVar6 = (long)*pauVar3 + lVar4;
    std::
    __introsort_loop<WavingSketch<8u,1u,4u>::node*,long,__gnu_cxx::__ops::_Iter_comp_iter<WavingSketch<8u,1u,4u>::mergebuck(WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*)::_lambda(WavingSketch<8u,1u,4u>::node,WavingSketch<8u,1u,4u>::node)_1_>>
              (pauVar3,lVar6,(int)LZCOUNT(lVar4 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<WavingSketch<8u,1u,4u>::node*,__gnu_cxx::__ops::_Iter_comp_iter<WavingSketch<8u,1u,4u>::mergebuck(WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*)::_lambda(WavingSketch<8u,1u,4u>::node,WavingSketch<8u,1u,4u>::node)_1_>>
              (pauVar3,lVar6);
  }
  lVar4 = 0;
  do {
    *(undefined4 *)dest->items[lVar4].str = *(undefined4 *)((long)*pauVar3 + lVar4 * 8 + 4);
    iVar5 = *(int *)((long)*pauVar3 + lVar4 * 8);
    dest->counters[lVar4] = iVar5;
    this->cnt = (this->cnt + 1) - (uint)(iVar5 == 0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  uVar2 = this->seed_s;
  lVar4 = 8;
  do {
    iVar5 = *(int *)((long)*pauVar3 + lVar4 * 8);
    if (-1 < iVar5) break;
    iVar1 = *(int *)((long)*pauVar3 + lVar4 * 8 + 4);
    uVar7 = ((uint)(iVar1 * -0x3361d2af) >> 0x11 | iVar1 * 0x16a88000) * 0x1b873593 ^ uVar2;
    uVar7 = (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
    uVar7 = (uVar7 >> 0x10 ^ uVar7 ^ 4) * -0x7a143595;
    uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
    dest->incast[0] = dest->incast[0] - (short)iVar5 * (short)COUNT[(uVar7 >> 0x10 ^ uVar7) & 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  operator_delete__(pauVar3);
  return;
}

Assistant:

void mergebuck(Bucket* src1, Bucket* src2, Bucket* dest) {
		for (int i = 0; i < counter_num; i++)
			dest->incast[i] = src1->incast[i] + src2->incast[i];
		node* tp1 = new node[slot_num << 1];
		node* p = tp1;
		for (uint32_t i = 0; i < slot_num; i++) {
			p->item = src1->items[i];
			p->counter = src1->counters[i];
			p++;
			cnt -= src1->counters[i] != 0;
		}
		for (uint32_t i = 0; i < slot_num; i++) {
			p->item = src2->items[i];
			p->counter = src2->counters[i];
			cnt -= src2->counters[i] != 0;
			p++;
		}
		std::sort(tp1, p, [](node x, node y)-> bool {return abs(x.counter) > abs(y.counter); });
		uint32_t i = 0;
		for (i = 0; i < slot_num; i++) {
			dest->items[i] = tp1[i].item;
			dest->counters[i] = tp1[i].counter;
			cnt += tp1[i].counter != 0;
		}
		uint32_t end = slot_num << 1;
		while (i < end && tp1[i].counter < 0)  // flag=true
		{
			uint32_t min_choice = tp1[i].item.Hash(seed_s) & 1;
			uint32_t whichcast = tp1[i].item.Hash(seed_incast) % counter_num;
			dest->incast[whichcast] -= COUNT[min_choice] * tp1[i].counter;
			i++;
		}
		delete[] tp1;
	}